

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  Btree **ppBtree;
  uint uVar1;
  sqlite3 *db;
  Db *pDVar2;
  Btree *pBVar3;
  char *pcVar4;
  Btree *pBVar5;
  Schema *pSVar6;
  undefined7 uVar7;
  u8 uVar8;
  undefined7 uVar9;
  sqlite3_context *pCtx;
  int iVar10;
  int iVar11;
  uchar *puVar12;
  uchar *z;
  Db *pDVar13;
  Schema *pSVar14;
  char *pcVar15;
  ulong uVar16;
  long lVar17;
  char *zErrDyn;
  sqlite3_context *local_60;
  uint flags;
  uchar *local_50;
  char *zErr;
  char *zPath;
  sqlite3_vfs *pVfs;
  
  db = context->pOut->db;
  zPath = (char *)0x0;
  zErr = (char *)0x0;
  zErrDyn = (char *)0x0;
  puVar12 = sqlite3_value_text(*argv);
  z = sqlite3_value_text(argv[1]);
  if (puVar12 == (uchar *)0x0) {
    puVar12 = "";
  }
  if (z == (uchar *)0x0) {
    z = "";
  }
  uVar1 = db->nDb;
  if ((int)uVar1 < db->aLimit[7] + 2) {
    if (db->autoCommit == '\0') {
      iVar10 = 0;
      zErrDyn = sqlite3MPrintf(db,"cannot ATTACH database within transaction");
    }
    else {
      uVar16 = 0;
      if (0 < (int)uVar1) {
        uVar16 = (ulong)uVar1;
      }
      pDVar13 = db->aDb;
      lVar17 = 0;
      local_60 = context;
      local_50 = puVar12;
      do {
        if (uVar16 * 0x20 + 0x20 == lVar17 + 0x20) {
          if (pDVar13 == db->aDbStatic) {
            pDVar13 = (Db *)sqlite3DbMallocRaw(db,0x60);
            if (pDVar13 == (Db *)0x0) {
              return;
            }
            pDVar2 = db->aDb;
            pcVar15 = pDVar2->zName;
            pBVar3 = pDVar2->pBt;
            uVar8 = pDVar2->safety_level;
            uVar9 = *(undefined7 *)&pDVar2->field_0x11;
            pSVar14 = pDVar2->pSchema;
            pcVar4 = pDVar2[1].zName;
            pBVar5 = pDVar2[1].pBt;
            uVar7 = *(undefined7 *)&pDVar2[1].field_0x11;
            pSVar6 = pDVar2[1].pSchema;
            pDVar13[1].safety_level = pDVar2[1].safety_level;
            *(undefined7 *)&pDVar13[1].field_0x11 = uVar7;
            pDVar13[1].pSchema = pSVar6;
            pDVar13[1].zName = pcVar4;
            pDVar13[1].pBt = pBVar5;
            pDVar13->safety_level = uVar8;
            *(undefined7 *)&pDVar13->field_0x11 = uVar9;
            pDVar13->pSchema = pSVar14;
            pDVar13->zName = pcVar15;
            pDVar13->pBt = pBVar3;
          }
          else {
            pDVar13 = (Db *)sqlite3DbRealloc(db,pDVar13,(long)(int)uVar1 * 0x20 + 0x20);
            if (pDVar13 == (Db *)0x0) {
              return;
            }
          }
          pCtx = local_60;
          db->aDb = pDVar13;
          iVar10 = db->nDb;
          *(undefined8 *)&pDVar13[iVar10].safety_level = 0;
          *(Schema **)(&pDVar13[iVar10].safety_level + 8) = (Schema *)0x0;
          pDVar13[iVar10].zName = (char *)0x0;
          pDVar13[iVar10].pBt = (Btree *)0x0;
          flags = db->openFlags;
          iVar11 = sqlite3ParseUri(db->pVfs->zName,(char *)local_50,&flags,&pVfs,&zPath,&zErr);
          pcVar4 = zPath;
          pcVar15 = zErr;
          if (iVar11 != 0) {
            if (iVar11 == 7) {
              db->mallocFailed = '\x01';
            }
            sqlite3_result_error(pCtx,zErr,-1);
            sqlite3_free(pcVar15);
            return;
          }
          pDVar13 = pDVar13 + iVar10;
          flags = flags | 0x100;
          ppBtree = &pDVar13->pBt;
          iVar11 = sqlite3BtreeOpen(pVfs,zPath,db,ppBtree,0,flags);
          sqlite3_free(pcVar4);
          db->nDb = db->nDb + 1;
          if (iVar11 == 0) {
            pSVar14 = sqlite3SchemaGet(db,pDVar13->pBt);
            pDVar13->pSchema = pSVar14;
            iVar11 = 7;
            if (((pSVar14 != (Schema *)0x0) && (iVar11 = 0, pSVar14->file_format != '\0')) &&
               (pSVar14->enc != db->enc)) {
              zErrDyn = sqlite3MPrintf(db,
                                       "attached databases must use the same text encoding as main database"
                                      );
              iVar11 = 1;
            }
            sqlite3BtreeEnter(*ppBtree);
            sqlite3PagerLockingMode((*ppBtree)->pBt->pPager,(uint)db->dfltLockMode);
            pBVar3 = *ppBtree;
            iVar10 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
            sqlite3BtreeSecureDelete(pBVar3,iVar10);
            sqlite3BtreeSetPagerFlags(*ppBtree,db->flags & 0x1cU | 3);
            sqlite3BtreeLeave(*ppBtree);
          }
          else if (iVar11 == 0x13) {
            zErrDyn = sqlite3MPrintf(db,"database is already attached");
            iVar11 = 1;
          }
          pDVar13->safety_level = '\x03';
          pcVar15 = sqlite3DbStrDup(db,(char *)z);
          pDVar13->zName = pcVar15;
          iVar10 = 0;
          if (pcVar15 == (char *)0x0) {
            iVar10 = 7;
          }
          if (iVar11 != 0) {
            iVar10 = iVar11;
          }
          if (iVar10 == 0) {
            sqlite3BtreeEnterAll(db);
            iVar10 = sqlite3Init(db,&zErrDyn);
            sqlite3BtreeLeaveAll(db);
            if (iVar10 == 0) {
              return;
            }
          }
          lVar17 = (long)db->nDb + -1;
          pBVar3 = db->aDb[lVar17].pBt;
          if (pBVar3 != (Btree *)0x0) {
            sqlite3BtreeClose(pBVar3);
            pDVar13 = db->aDb;
            pDVar13[lVar17].pBt = (Btree *)0x0;
            pDVar13[lVar17].pSchema = (Schema *)0x0;
          }
          sqlite3ResetAllSchemasOfConnection(db);
          context = local_60;
          db->nDb = (int)lVar17;
          if ((iVar10 == 0xc0a) || (iVar10 == 7)) {
            db->mallocFailed = '\x01';
            sqlite3DbFree(db,zErrDyn);
            zErrDyn = sqlite3MPrintf(db,"out of memory");
            context = local_60;
          }
          else {
            if (zErrDyn != (char *)0x0) goto LAB_0015fd73;
            zErrDyn = sqlite3MPrintf(db,"unable to open database: %s",local_50);
          }
          goto LAB_0015fd6e;
        }
        iVar10 = sqlite3_stricmp(*(char **)((long)&pDVar13->zName + lVar17),(char *)z);
        lVar17 = lVar17 + 0x20;
      } while (iVar10 != 0);
      iVar10 = 0;
      zErrDyn = sqlite3MPrintf(db,"database %s is already in use",z);
      context = local_60;
    }
  }
  else {
    iVar10 = 0;
    zErrDyn = sqlite3MPrintf(db,"too many attached databases - max %d");
  }
LAB_0015fd6e:
  if (zErrDyn != (char *)0x0) {
LAB_0015fd73:
    sqlite3_result_error(context,zErrDyn,-1);
    sqlite3DbFree(db,zErrDyn);
  }
  if (iVar10 != 0) {
    sqlite3_result_error_code(context,iVar10);
  }
  return;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);

  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

  /* Check for the following errors:
  **
  **     * Too many attached databases,
  **     * Transaction currently open
  **     * Specified database name already being used.
  */
  if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
    zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
      db->aLimit[SQLITE_LIMIT_ATTACHED]
    );
    goto attach_error;
  }
  if( !db->autoCommit ){
    zErrDyn = sqlite3MPrintf(db, "cannot ATTACH database within transaction");
    goto attach_error;
  }
  for(i=0; i<db->nDb; i++){
    char *z = db->aDb[i].zName;
    assert( z && zName );
    if( sqlite3StrICmp(z, zName)==0 ){
      zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
      goto attach_error;
    }
  }

  /* Allocate the new entry in the db->aDb[] array and initialize the schema
  ** hash tables.
  */
  if( db->aDb==db->aDbStatic ){
    aNew = sqlite3DbMallocRaw(db, sizeof(db->aDb[0])*3 );
    if( aNew==0 ) return;
    memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
  }else{
    aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
    if( aNew==0 ) return;
  }
  db->aDb = aNew;
  aNew = &db->aDb[db->nDb];
  memset(aNew, 0, sizeof(*aNew));

  /* Open the database file. If the btree is successfully opened, use
  ** it to obtain the database schema. At this point the schema may
  ** or may not be initialized.
  */
  flags = db->openFlags;
  rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_NOMEM ) db->mallocFailed = 1;
    sqlite3_result_error(context, zErr, -1);
    sqlite3_free(zErr);
    return;
  }
  assert( pVfs );
  flags |= SQLITE_OPEN_MAIN_DB;
  rc = sqlite3BtreeOpen(pVfs, zPath, db, &aNew->pBt, 0, flags);
  sqlite3_free( zPath );
  db->nDb++;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    aNew->pSchema = sqlite3SchemaGet(db, aNew->pBt);
    if( !aNew->pSchema ){
      rc = SQLITE_NOMEM;
    }else if( aNew->pSchema->file_format && aNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(aNew->pBt);
    pPager = sqlite3BtreePager(aNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(aNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(aNew->pBt, 3 | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(aNew->pBt);
  }
  aNew->safety_level = 3;
  aNew->zName = sqlite3DbStrDup(db, zName);
  if( rc==SQLITE_OK && aNew->zName==0 ){
    rc = SQLITE_NOMEM;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from the main database */
        sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
        if( nKey>0 || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
          rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        }
        break;
    }
  }
#endif

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the way
  ** we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    rc = sqlite3Init(db, &zErrDyn);
    sqlite3BtreeLeaveAll(db);
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    int iDb = db->nDb - 1;
    assert( iDb>=2 );
    if( db->aDb[iDb].pBt ){
      sqlite3BtreeClose(db->aDb[iDb].pBt);
      db->aDb[iDb].pBt = 0;
      db->aDb[iDb].pSchema = 0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = iDb;
    if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
      db->mallocFailed = 1;
      sqlite3DbFree(db, zErrDyn);
      zErrDyn = sqlite3MPrintf(db, "out of memory");
    }else if( zErrDyn==0 ){
      zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}